

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O0

ListNode * list_add(ListNode *head,ListNode *new_node)

{
  ListNode *in_RSI;
  ListNode *in_RDI;
  unsigned_long unaff_retaddr;
  int in_stack_ffffffffffffffec;
  
  _assert_true(unaff_retaddr,(char *)in_RDI,(char *)in_RSI,in_stack_ffffffffffffffec);
  _assert_true(unaff_retaddr,(char *)in_RDI,(char *)in_RSI,in_stack_ffffffffffffffec);
  in_RSI->next = in_RDI;
  in_RSI->prev = in_RDI->prev;
  in_RDI->prev->next = in_RSI;
  in_RDI->prev = in_RSI;
  return in_RSI;
}

Assistant:

static ListNode* list_add(ListNode * const head, ListNode *new_node) {
    assert_non_null(head);
    assert_non_null(new_node);
    new_node->next = head;
    new_node->prev = head->prev;
    head->prev->next = new_node;
    head->prev = new_node;
    return new_node;
}